

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O0

bool __thiscall benchmark::CSVReporter::ReportContext(CSVReporter *this,Context *context)

{
  char *pcVar1;
  ostream *poVar2;
  string local_38 [32];
  Context *local_18;
  Context *context_local;
  CSVReporter *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  poVar2 = std::operator<<((ostream *)&std::cerr,"Run on (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18->num_cpus);
  poVar2 = std::operator<<(poVar2," X ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18->mhz_per_cpu);
  poVar2 = std::operator<<(poVar2," MHz CPU ");
  pcVar1 = ".[\\*^$\n";
  if (1 < local_18->num_cpus) {
    pcVar1 = "\"%s\": %s";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 7);
  std::operator<<(poVar2,")\n");
  LocalDateTimeString_abi_cxx11_();
  poVar2 = std::operator<<((ostream *)&std::cerr,local_38);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_38);
  if ((local_18->cpu_scaling_enabled & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incure extra overhead.\n"
                   );
  }
  std::operator<<((ostream *)&std::cerr,
                  "***WARNING*** Library was built as DEBUG. Timings may be affected.\n");
  std::operator<<((ostream *)&std::cout,
                  "name,iterations,real_time,cpu_time,bytes_per_second,items_per_second,label\n");
  return true;
}

Assistant:

bool CSVReporter::ReportContext(const Context& context) {
  std::cerr << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  std::cerr << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    std::cerr << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incure extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  std::cerr << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif
  std::cout << "name,iterations,real_time,cpu_time,bytes_per_second,"
               "items_per_second,label\n";
  return true;
}